

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O0

intrusive_ptr<booster::callable<void_()>_> * __thiscall
booster::intrusive_ptr<booster::callable<void_()>_>::operator=
          (intrusive_ptr<booster::callable<void_()>_> *this,callable<void_()> *rhs)

{
  intrusive_ptr<booster::callable<void_()>_> *in_RDI;
  callable<void_()> *in_stack_ffffffffffffffd8;
  intrusive_ptr<booster::callable<void_()>_> *in_stack_ffffffffffffffe0;
  intrusive_ptr<booster::callable<void_()>_> local_18 [3];
  
  intrusive_ptr(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,SUB81((ulong)in_RDI >> 0x38,0));
  swap(local_18,in_RDI);
  ~intrusive_ptr(in_RDI);
  return in_RDI;
}

Assistant:

intrusive_ptr & operator=(T * rhs)
    {
        this_type(rhs).swap(*this);
        return *this;
    }